

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O1

void __thiscall
vkt::sr::anon_unknown_0::TriangleDerivateCaseInstance::setupDefaultInputs
          (TriangleDerivateCaseInstance *this)

{
  DerivateCaseValues *pDVar1;
  float coords [16];
  float positions [16];
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = 0x3f8000003f800000;
  uStack_10 = 0x3f80000000000000;
  local_28 = 0xbf8000003f800000;
  uStack_20 = 0x3f80000000000000;
  local_38 = 0x3f800000bf800000;
  uStack_30 = 0x3f80000000000000;
  local_48 = 0xbf800000bf800000;
  uStack_40 = 0x3f80000000000000;
  pDVar1 = this->m_values;
  local_88 = (pDVar1->coordMin).m_data[0];
  local_84 = (pDVar1->coordMin).m_data[1];
  local_80 = (pDVar1->coordMin).m_data[2];
  local_7c = (pDVar1->coordMax).m_data[3];
  local_78 = (pDVar1->coordMin).m_data[0];
  local_74 = (pDVar1->coordMax).m_data[1];
  local_70 = ((pDVar1->coordMin).m_data[2] + (pDVar1->coordMax).m_data[2]) * 0.5;
  local_6c = (local_7c + (pDVar1->coordMin).m_data[3]) * 0.5;
  local_68 = (pDVar1->coordMax).m_data[0];
  local_64 = (pDVar1->coordMin).m_data[1];
  local_60 = ((pDVar1->coordMin).m_data[2] + (pDVar1->coordMax).m_data[2]) * 0.5;
  local_5c = ((pDVar1->coordMin).m_data[3] + (pDVar1->coordMax).m_data[3]) * 0.5;
  local_58 = (pDVar1->coordMax).m_data[0];
  local_54 = (pDVar1->coordMax).m_data[1];
  local_50 = (pDVar1->coordMax).m_data[2];
  local_4c = (pDVar1->coordMin).m_data[3];
  ShaderRenderCaseInstance::addAttribute
            (&this->super_ShaderRenderCaseInstance,0,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,4,&local_48)
  ;
  if (this->m_definitions->coordDataType != TYPE_LAST) {
    ShaderRenderCaseInstance::addAttribute
              (&this->super_ShaderRenderCaseInstance,1,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,4,
               &local_88);
  }
  return;
}

Assistant:

void TriangleDerivateCaseInstance::setupDefaultInputs (void)
{
	const int		numVertices			= 4;
	const float		positions[]			=
	{
		-1.0f, -1.0f, 0.0f, 1.0f,
		-1.0f,  1.0f, 0.0f, 1.0f,
		1.0f, -1.0f, 0.0f, 1.0f,
		1.0f,  1.0f, 0.0f, 1.0f
	};
	const float		coords[]			=
	{
		m_values.coordMin.x(), m_values.coordMin.y(), m_values.coordMin.z(),								m_values.coordMax.w(),
		m_values.coordMin.x(), m_values.coordMax.y(), (m_values.coordMin.z()+m_values.coordMax.z())*0.5f,	(m_values.coordMin.w()+m_values.coordMax.w())*0.5f,
		m_values.coordMax.x(), m_values.coordMin.y(), (m_values.coordMin.z()+m_values.coordMax.z())*0.5f,	(m_values.coordMin.w()+m_values.coordMax.w())*0.5f,
		m_values.coordMax.x(), m_values.coordMax.y(), m_values.coordMax.z(),								m_values.coordMin.w()
	};

	addAttribute(0u, vk::VK_FORMAT_R32G32B32A32_SFLOAT, 4 * (deUint32)sizeof(float), numVertices, positions);
	if (m_definitions.coordDataType != glu::TYPE_LAST)
		addAttribute(1u, vk::VK_FORMAT_R32G32B32A32_SFLOAT, 4 * (deUint32)sizeof(float), numVertices, coords);
}